

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_layout.h
# Opt level: O0

void __thiscall
agge::tests::ref_glyph_run::ref_glyph_run<1ul>
          (ref_glyph_run *this,shared_ptr<agge::font> *font_,real_t offset_x,real_t offset_y,
          positioned_glyph (*positioned) [1])

{
  agge_vector<float> aVar1;
  positioned_glyph *this_00;
  positioned_glyph *begin;
  positioned_glyph *end;
  positioned_glyph (*positioned_local) [1];
  real_t offset_y_local;
  real_t offset_x_local;
  shared_ptr<agge::font> *font__local;
  ref_glyph_run *this_local;
  
  std::shared_ptr<agge::font>::shared_ptr(&this->_font,font_);
  end = (positioned_glyph *)&this->_offset;
  aVar1 = create_vector<float>(offset_x,offset_y);
  ((vector_r *)end)->dx = aVar1.dx;
  ((vector_r *)end)->dy = aVar1.dy;
  this_00 = begin<agge::positioned_glyph,1ul>(positioned);
  begin = end<agge::positioned_glyph,1ul>(positioned);
  mkvector<agge::positioned_glyph*>(&this->_glyphs,(tests *)this_00,begin,end);
  this->_check_glyph_advances = true;
  return;
}

Assistant:

inline ref_glyph_run::ref_glyph_run(shared_ptr<font> font_, real_t offset_x, real_t offset_y,
				positioned_glyph (&positioned)[n])
			: _font(font_), _offset(create_vector(offset_x, offset_y)), _glyphs(mkvector(begin(positioned),
				end(positioned))), _check_glyph_advances(true)
		{	}